

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O0

void u16To(void *dest,size_t count,u16 *src)

{
  void *in_RDX;
  void *in_RSI;
  
  memMove(in_RSI,in_RDX,0x119b85);
  return;
}

Assistant:

void u16To(void* dest, size_t count, const u16 src[])
{
	ASSERT(memIsValid(src, count + count % 2));
	ASSERT(memIsValid(dest, count));
	memMove(dest, src, count);
#if (OCTET_ORDER == BIG_ENDIAN)
	if (count % 2)
	{
		register u16 u = src[--count / 2];
		((octet*)dest)[count] = (octet)u;
		u = 0;
	}
	for (count /= 2; count--;)
		((u16*)dest)[count] = u16Rev(((u16*)dest)[count]);
#endif // OCTET_ORDER
}